

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHandlerCommand.cxx
# Opt level: O0

bool __thiscall
cmCTestHandlerCommand::InitialPass
          (cmCTestHandlerCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  cmCTest *pcVar2;
  uint uVar3;
  int iVar4;
  size_type sVar5;
  const_reference pvVar6;
  ostream *poVar7;
  char *pcVar8;
  reference ppcVar9;
  undefined4 extraout_var;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 collapse;
  string local_df8 [39];
  allocator local_dd1;
  string local_dd0;
  ostringstream local_db0 [8];
  ostringstream str;
  allocator local_c31;
  int res;
  string local_c10;
  undefined1 local_bf0 [8];
  string current_dir;
  ostringstream local_bb0 [8];
  ostringstream cmCTestLog_msg_4;
  string local_a38 [32];
  string local_a18 [32];
  ostringstream local_9f8 [8];
  ostringstream cmCTestLog_msg_3;
  cmCTestGenericHandler *handler;
  ostringstream local_858 [8];
  ostringstream cmCTestLog_msg_2;
  allocator local_6d9;
  string local_6d8;
  char *local_6b8;
  char *changeId;
  string local_6a8;
  string local_688;
  string local_668;
  allocator local_641;
  string local_640;
  string local_620;
  string local_600 [32];
  ostringstream local_5e0 [8];
  ostringstream cmCTestLog_msg_1;
  string local_468 [32];
  ostringstream local_448 [8];
  ostringstream cmCTestLog_msg;
  allocator local_2c9;
  string local_2c8;
  string local_2a8;
  allocator local_281;
  string local_280;
  char *local_260;
  char *bdir;
  string local_250;
  string local_230;
  allocator local_209;
  string local_208;
  char *local_1e8;
  char *ctestConfigType;
  ostringstream local_1b0 [8];
  ostringstream e;
  uint local_34;
  value_type pcStack_30;
  uint i;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCTestHandlerCommand *this_local;
  cmCTestGenericHandler *this_00;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::clear(&this->Values);
  pcStack_30 = (value_type)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
            (&this->Values,this->Last,&stack0xffffffffffffffd0);
  this->ArgumentDoing = 0;
  local_34 = 0;
  do {
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
    if (sVar5 <= local_34) {
      pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_208,"CTEST_CONFIGURATION_TYPE",&local_209);
      pcVar8 = cmMakefile::GetDefinition(pcVar1,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator((allocator<char> *)&local_209);
      local_1e8 = pcVar8;
      if (pcVar8 != (char *)0x0) {
        cmCTest::SetConfigType((this->super_cmCTestCommand).CTest,pcVar8);
      }
      ppcVar9 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (&this->Values,2);
      if (*ppcVar9 == (value_type)0x0) {
        pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_280,"CTEST_BINARY_DIRECTORY",&local_281);
        pcVar8 = cmMakefile::GetSafeDefinition(pcVar1,&local_280);
        std::__cxx11::string::~string((string *)&local_280);
        std::allocator<char>::~allocator((allocator<char> *)&local_281);
        local_260 = pcVar8;
        if (pcVar8 == (char *)0x0) {
          std::__cxx11::ostringstream::ostringstream(local_448);
          poVar7 = std::operator<<((ostream *)local_448,"CTEST_BINARY_DIRECTORY not set");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          pcVar2 = (this->super_cmCTestCommand).CTest;
          std::__cxx11::ostringstream::str();
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar2,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                       ,0x5d,pcVar8,false);
          std::__cxx11::string::~string(local_468);
          std::__cxx11::ostringstream::~ostringstream(local_448);
        }
        else {
          pcVar2 = (this->super_cmCTestCommand).CTest;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_2c8,pcVar8,&local_2c9);
          cmsys::SystemTools::CollapseFullPath(&local_2a8,&local_2c8);
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmCTest::SetCTestConfiguration(pcVar2,"BuildDirectory",pcVar8,(bool)(this->Quiet & 1));
          std::__cxx11::string::~string((string *)&local_2a8);
          std::__cxx11::string::~string((string *)&local_2c8);
          std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
        }
      }
      else {
        pcVar2 = (this->super_cmCTestCommand).CTest;
        ppcVar9 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            (&this->Values,2);
        pcVar8 = *ppcVar9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_250,pcVar8,(allocator *)((long)&bdir + 7));
        cmsys::SystemTools::CollapseFullPath(&local_230,&local_250);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::SetCTestConfiguration(pcVar2,"BuildDirectory",pcVar8,(bool)(this->Quiet & 1));
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&local_250);
        std::allocator<char>::~allocator((allocator<char> *)((long)&bdir + 7));
      }
      ppcVar9 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (&this->Values,3);
      if (*ppcVar9 == (value_type)0x0) {
        pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
        pcVar2 = (this->super_cmCTestCommand).CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_6a8,"CTEST_SOURCE_DIRECTORY",(allocator *)((long)&changeId + 7))
        ;
        pcVar8 = cmMakefile::GetSafeDefinition(pcVar1,&local_6a8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_688,pcVar8,(allocator *)((long)&changeId + 6))
        ;
        cmsys::SystemTools::CollapseFullPath(&local_668,&local_688);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::SetCTestConfiguration(pcVar2,"SourceDirectory",pcVar8,(bool)(this->Quiet & 1));
        std::__cxx11::string::~string((string *)&local_668);
        std::__cxx11::string::~string((string *)&local_688);
        std::allocator<char>::~allocator((allocator<char> *)((long)&changeId + 6));
        std::__cxx11::string::~string((string *)&local_6a8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&changeId + 7));
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_5e0);
        poVar7 = std::operator<<((ostream *)local_5e0,"Set source directory to: ");
        ppcVar9 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            (&this->Values,3);
        poVar7 = std::operator<<(poVar7,*ppcVar9);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        pcVar2 = (this->super_cmCTestCommand).CTest;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                     ,99,pcVar8,false);
        std::__cxx11::string::~string(local_600);
        std::__cxx11::ostringstream::~ostringstream(local_5e0);
        pcVar2 = (this->super_cmCTestCommand).CTest;
        ppcVar9 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            (&this->Values,3);
        pcVar8 = *ppcVar9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_640,pcVar8,&local_641);
        cmsys::SystemTools::CollapseFullPath(&local_620,&local_640);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::SetCTestConfiguration(pcVar2,"SourceDirectory",pcVar8,(bool)(this->Quiet & 1));
        std::__cxx11::string::~string((string *)&local_620);
        std::__cxx11::string::~string((string *)&local_640);
        std::allocator<char>::~allocator((allocator<char> *)&local_641);
      }
      pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_6d8,"CTEST_CHANGE_ID",&local_6d9);
      pcVar8 = cmMakefile::GetDefinition(pcVar1,&local_6d8);
      std::__cxx11::string::~string((string *)&local_6d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
      local_6b8 = pcVar8;
      if (pcVar8 != (char *)0x0) {
        cmCTest::SetCTestConfiguration
                  ((this->super_cmCTestCommand).CTest,"ChangeId",pcVar8,(bool)(this->Quiet & 1));
      }
      std::__cxx11::ostringstream::ostringstream(local_858);
      poVar7 = std::operator<<((ostream *)local_858,"Initialize handler");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      pcVar2 = (this->super_cmCTestCommand).CTest;
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar2,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                   ,0x76,pcVar8,false);
      std::__cxx11::string::~string((string *)&handler);
      std::__cxx11::ostringstream::~ostringstream(local_858);
      iVar4 = (*(this->super_cmCTestCommand).super_cmCommand.super_cmObject._vptr_cmObject[0xc])();
      this_00 = (cmCTestGenericHandler *)CONCAT44(extraout_var,iVar4);
      if (this_00 == (cmCTestGenericHandler *)0x0) {
        std::__cxx11::ostringstream::ostringstream(local_9f8);
        poVar7 = std::operator<<((ostream *)local_9f8,"Cannot instantiate test handler ");
        (*(this->super_cmCTestCommand).super_cmCommand.super_cmObject._vptr_cmObject[0xb])
                  (local_a18);
        poVar7 = std::operator<<(poVar7,local_a18);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_a18);
        pcVar2 = (this->super_cmCTestCommand).CTest;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                     ,0x7c,pcVar8,false);
        std::__cxx11::string::~string(local_a38);
        std::__cxx11::ostringstream::~ostringstream(local_9f8);
        this_local._7_1_ = 0;
      }
      else {
        cmCTestGenericHandler::SetAppendXML(this_00,(bool)(this->AppendXML & 1));
        (*(this_00->super_cmObject)._vptr_cmObject[4])
                  (this_00,(this->super_cmCTestCommand).super_cmCommand.Makefile);
        ppcVar9 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            (&this->Values,4);
        collapse = extraout_DL;
        if (*ppcVar9 != (value_type)0x0) {
          iVar4 = cmCTest::GetDropSiteCDash((this->super_cmCTestCommand).CTest);
          if ((iVar4 == 0) &&
             (iVar4 = cmCTest::GetDartVersion((this->super_cmCTestCommand).CTest), iVar4 < 2)) {
            std::__cxx11::ostringstream::ostringstream(local_bb0);
            poVar7 = std::operator<<((ostream *)local_bb0,
                                     "Dart before version 2.0 does not support collecting submissions."
                                    );
            poVar7 = (ostream *)
                     std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            poVar7 = std::operator<<(poVar7,
                                     "Please upgrade the server to Dart 2 or higher, or do not use SUBMIT_INDEX."
                                    );
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            pcVar2 = (this->super_cmCTestCommand).CTest;
            std::__cxx11::ostringstream::str();
            pcVar8 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar2,6,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                         ,0x8b,pcVar8,false);
            std::__cxx11::string::~string((string *)(current_dir.field_2._M_local_buf + 8));
            std::__cxx11::ostringstream::~ostringstream(local_bb0);
            collapse = extraout_DL_00;
          }
          else {
            ppcVar9 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                                (&this->Values,4);
            iVar4 = atoi(*ppcVar9);
            cmCTestGenericHandler::SetSubmitIndex(this_00,iVar4);
            collapse = extraout_DL_01;
          }
        }
        cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                  ((string *)local_bf0,(SystemTools *)0x1,(bool)collapse);
        pcVar2 = (this->super_cmCTestCommand).CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&res,"BuildDirectory",&local_c31);
        cmCTest::GetCTestConfiguration(&local_c10,pcVar2,(string *)&res);
        cmsys::SystemTools::ChangeDirectory(&local_c10);
        std::__cxx11::string::~string((string *)&local_c10);
        std::__cxx11::string::~string((string *)&res);
        std::allocator<char>::~allocator((allocator<char> *)&local_c31);
        iVar4 = (*(this_00->super_cmObject)._vptr_cmObject[5])();
        ppcVar9 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            (&this->Values,1);
        if ((*ppcVar9 != (value_type)0x0) &&
           (ppcVar9 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                                (&this->Values,1), **ppcVar9 != '\0')) {
          std::__cxx11::ostringstream::ostringstream(local_db0);
          std::ostream::operator<<(local_db0,iVar4);
          pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
          ppcVar9 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                              (&this->Values,1);
          pcVar8 = *ppcVar9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_dd0,pcVar8,&local_dd1);
          std::__cxx11::ostringstream::str();
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmMakefile::AddDefinition(pcVar1,&local_dd0,pcVar8);
          std::__cxx11::string::~string(local_df8);
          std::__cxx11::string::~string((string *)&local_dd0);
          std::allocator<char>::~allocator((allocator<char> *)&local_dd1);
          std::__cxx11::ostringstream::~ostringstream(local_db0);
        }
        cmsys::SystemTools::ChangeDirectory((string *)local_bf0);
        this_local._7_1_ = 1;
        std::__cxx11::string::~string((string *)local_bf0);
      }
LAB_00593c6d:
      return (bool)(this_local._7_1_ & 1);
    }
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,(ulong)local_34);
    uVar3 = (*(this->super_cmCTestCommand).super_cmCommand.super_cmObject._vptr_cmObject[0xd])
                      (this,pvVar6);
    if ((uVar3 & 1) == 0) {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,(ulong)local_34);
      uVar3 = (*(this->super_cmCTestCommand).super_cmCommand.super_cmObject._vptr_cmObject[0xe])
                        (this,pvVar6);
      if ((uVar3 & 1) == 0) {
        std::__cxx11::ostringstream::ostringstream(local_1b0);
        poVar7 = std::operator<<((ostream *)local_1b0,"called with unknown argument \"");
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,(ulong)local_34);
        poVar7 = std::operator<<(poVar7,(string *)pvVar6);
        std::operator<<(poVar7,"\".");
        std::__cxx11::ostringstream::str();
        cmCommand::SetError((cmCommand *)this,(string *)&ctestConfigType);
        std::__cxx11::string::~string((string *)&ctestConfigType);
        this_local._7_1_ = 0;
        std::__cxx11::ostringstream::~ostringstream(local_1b0);
        goto LAB_00593c6d;
      }
    }
    if (this->ArgumentDoing == 1) {
      this_local._7_1_ = 0;
      goto LAB_00593c6d;
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

bool cmCTestHandlerCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  // Allocate space for argument values.
  this->Values.clear();
  this->Values.resize(this->Last, 0);

  // Process input arguments.
  this->ArgumentDoing = ArgumentDoingNone;
  for(unsigned int i=0; i < args.size(); ++i)
    {
    // Check this argument.
    if(!this->CheckArgumentKeyword(args[i]) &&
       !this->CheckArgumentValue(args[i]))
      {
      std::ostringstream e;
      e << "called with unknown argument \"" << args[i] << "\".";
      this->SetError(e.str());
      return false;
      }

    // Quit if an argument is invalid.
    if(this->ArgumentDoing == ArgumentDoingError)
      {
      return false;
      }
    }

  // Set the config type of this ctest to the current value of the
  // CTEST_CONFIGURATION_TYPE script variable if it is defined.
  // The current script value trumps the -C argument on the command
  // line.
  const char* ctestConfigType =
    this->Makefile->GetDefinition("CTEST_CONFIGURATION_TYPE");
  if (ctestConfigType)
    {
    this->CTest->SetConfigType(ctestConfigType);
    }

  if ( this->Values[ct_BUILD] )
    {
    this->CTest->SetCTestConfiguration("BuildDirectory",
      cmSystemTools::CollapseFullPath(
        this->Values[ct_BUILD]).c_str(), this->Quiet);
    }
  else
    {
    const char* bdir =
      this->Makefile->GetSafeDefinition("CTEST_BINARY_DIRECTORY");
    if(bdir)
      {
      this->
        CTest->SetCTestConfiguration("BuildDirectory",
          cmSystemTools::CollapseFullPath(bdir).c_str(), this->Quiet);
      }
    else
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "CTEST_BINARY_DIRECTORY not set" << std::endl;);
      }
    }
  if ( this->Values[ct_SOURCE] )
    {
    cmCTestLog(this->CTest, DEBUG,
      "Set source directory to: " << this->Values[ct_SOURCE] << std::endl);
    this->CTest->SetCTestConfiguration("SourceDirectory",
      cmSystemTools::CollapseFullPath(
        this->Values[ct_SOURCE]).c_str(), this->Quiet);
    }
  else
    {
    this->CTest->SetCTestConfiguration("SourceDirectory",
      cmSystemTools::CollapseFullPath(
        this->Makefile->GetSafeDefinition("CTEST_SOURCE_DIRECTORY")).c_str(),
      this->Quiet);
    }

  if(const char* changeId =
     this->Makefile->GetDefinition("CTEST_CHANGE_ID"))
    {
    this->CTest->SetCTestConfiguration("ChangeId", changeId, this->Quiet);
    }

  cmCTestLog(this->CTest, DEBUG, "Initialize handler" << std::endl;);
  cmCTestGenericHandler* handler = this->InitializeHandler();
  if ( !handler )
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot instantiate test handler " << this->GetName()
               << std::endl);
    return false;
    }

  handler->SetAppendXML(this->AppendXML);

  handler->PopulateCustomVectors(this->Makefile);
  if ( this->Values[ct_SUBMIT_INDEX] )
    {
    if(!this->CTest->GetDropSiteCDash() && this->CTest->GetDartVersion() <= 1)
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
        "Dart before version 2.0 does not support collecting submissions."
        << std::endl
        << "Please upgrade the server to Dart 2 or higher, or do not use "
        "SUBMIT_INDEX." << std::endl);
      }
    else
      {
      handler->SetSubmitIndex(atoi(this->Values[ct_SUBMIT_INDEX]));
      }
    }
  std::string current_dir = cmSystemTools::GetCurrentWorkingDirectory();
  cmSystemTools::ChangeDirectory(
    this->CTest->GetCTestConfiguration("BuildDirectory"));
  int res = handler->ProcessHandler();
  if ( this->Values[ct_RETURN_VALUE] && *this->Values[ct_RETURN_VALUE])
    {
    std::ostringstream str;
    str << res;
    this->Makefile->AddDefinition(
      this->Values[ct_RETURN_VALUE], str.str().c_str());
    }
  cmSystemTools::ChangeDirectory(current_dir);
  return true;
}